

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void GEO::parallel(function<void_()> *f1,function<void_()> *f2)

{
  int *piVar1;
  ParallelThread *pPVar2;
  SmartPointer<GEO::Thread> local_80;
  ThreadGroup threads;
  function<void_()> local_60;
  function<void_()> local_40;
  
  if (0 < ::(anonymous_namespace)::running_threads_invocations_) {
    std::function<void_()>::operator()(f1);
    std::function<void_()>::operator()(f2);
    return;
  }
  threads.
  super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  threads.
  super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.
  super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar2 = (ParallelThread *)operator_new(0x30);
  std::function<void_()>::function(&local_40,f1);
  anon_unknown.dwarf_5db41::ParallelThread::ParallelThread(pPVar2,&local_40);
  piVar1 = &(pPVar2->super_Thread).super_Counted.nb_refs_;
  *piVar1 = *piVar1 + 1;
  local_80.pointer_ = (Thread *)pPVar2;
  std::vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>>::
  emplace_back<GEO::SmartPointer<GEO::Thread>>
            ((vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>>
              *)&threads,&local_80);
  SmartPointer<GEO::Thread>::~SmartPointer(&local_80);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  pPVar2 = (ParallelThread *)operator_new(0x30);
  std::function<void_()>::function(&local_60,f2);
  anon_unknown.dwarf_5db41::ParallelThread::ParallelThread(pPVar2,&local_60);
  piVar1 = &(pPVar2->super_Thread).super_Counted.nb_refs_;
  *piVar1 = *piVar1 + 1;
  local_80.pointer_ = (Thread *)pPVar2;
  std::vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>>::
  emplace_back<GEO::SmartPointer<GEO::Thread>>
            ((vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>>
              *)&threads,&local_80);
  SmartPointer<GEO::Thread>::~SmartPointer(&local_80);
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  Process::run_threads(&threads);
  std::vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>::
  ~vector(&threads);
  return;
}

Assistant:

void parallel(
	std::function<void()> f1,
	std::function<void()> f2
    ) {
        if(Process::is_running_threads()) {
	    f1();
	    f2();
        } else {
            ThreadGroup threads;
	    threads.push_back(new ParallelThread(f1));
	    threads.push_back(new ParallelThread(f2));
            Process::run_threads(threads);
        }
    }